

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::xml_document::save
          (xml_document *this,xml_writer *writer,char_t *indent,uint flags,xml_encoding encoding)

{
  xml_node_struct *pxVar1;
  uint uVar2;
  size_t size;
  xml_buffered_writer local_2838;
  
  local_2838.bufsize = 0;
  local_2838.encoding = encoding;
  if ((encoding < encoding_latin1) && ((0x191U >> (encoding & 0x1f) & 1) != 0)) {
    local_2838.encoding = *(xml_encoding *)(&DAT_001ed214 + (ulong)encoding * 4);
  }
  if (encoding != encoding_latin1 && (flags & 2) != 0) {
    local_2838.buffer[0] = -0x11;
    local_2838.buffer[1] = -0x45;
    local_2838.buffer[2] = -0x41;
    local_2838.bufsize = 3;
  }
  local_2838.writer = writer;
  size = local_2838.bufsize;
  if ((flags & 8) == 0) {
    pxVar1 = ((this->super_xml_node)._root)->first_child;
    while ((pxVar1 != (xml_node_struct *)0x0 && (uVar2 = (uint)pxVar1->header & 0xf, uVar2 != 2))) {
      if (uVar2 == 7) goto LAB_001341e5;
      pxVar1 = pxVar1->next_sibling;
    }
    impl::anon_unknown_0::xml_buffered_writer::write_string(&local_2838,"<?xml version=\"1.0\"");
    if (encoding == encoding_latin1) {
      impl::anon_unknown_0::xml_buffered_writer::write_string
                (&local_2838," encoding=\"ISO-8859-1\"");
    }
    if (0x7fe < local_2838.bufsize) {
      impl::anon_unknown_0::xml_buffered_writer::flush
                (&local_2838,local_2838.buffer,local_2838.bufsize);
      local_2838.bufsize = 0;
    }
    (local_2838.buffer + local_2838.bufsize)[0] = '?';
    (local_2838.buffer + local_2838.bufsize)[1] = '>';
    size = local_2838.bufsize + 2;
    if ((flags & 4) == 0) {
      if (0x7fd < local_2838.bufsize) {
        local_2838.bufsize = size;
        impl::anon_unknown_0::xml_buffered_writer::flush(&local_2838,local_2838.buffer,size);
        size = 0;
      }
      local_2838.buffer[size] = '\n';
      size = size + 1;
    }
  }
LAB_001341e5:
  local_2838.bufsize = size;
  impl::anon_unknown_0::node_output(&local_2838,(this->super_xml_node)._root,indent,flags,0);
  impl::anon_unknown_0::xml_buffered_writer::flush(&local_2838,local_2838.buffer,local_2838.bufsize)
  ;
  return;
}

Assistant:

PUGI__FN void xml_document::save(xml_writer& writer, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		impl::xml_buffered_writer buffered_writer(writer, encoding);

		if ((flags & format_write_bom) && encoding != encoding_latin1)
		{
			// BOM always represents the codepoint U+FEFF, so just write it in native encoding
		#ifdef PUGIXML_WCHAR_MODE
			unsigned int bom = 0xfeff;
			buffered_writer.write(static_cast<wchar_t>(bom));
		#else
			buffered_writer.write('\xef', '\xbb', '\xbf');
		#endif
		}

		if (!(flags & format_no_declaration) && !impl::has_declaration(_root))
		{
			buffered_writer.write_string(PUGIXML_TEXT("<?xml version=\"1.0\""));
			if (encoding == encoding_latin1) buffered_writer.write_string(PUGIXML_TEXT(" encoding=\"ISO-8859-1\""));
			buffered_writer.write('?', '>');
			if (!(flags & format_raw)) buffered_writer.write('\n');
		}

		impl::node_output(buffered_writer, _root, indent, flags, 0);

		buffered_writer.flush();
	}